

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_kfold_conv_knum_u32_num(jit_State *J)

{
  jit_State *J_local;
  
  (J->fold).ins.field_1.op12 = (IRRef2)(long)*(double *)(ulong)(J->fold).left.field_1.op12;
  return 2;
}

Assistant:

LJFOLD(CONV KNUM IRCONV_U32_NUM)
LJFOLDF(kfold_conv_knum_u32_num)
{
  lua_assert((fins->op2 & IRCONV_TRUNC));
#ifdef _MSC_VER
  {  /* Workaround for MSVC bug. */
    volatile uint32_t u = (uint32_t)knumleft;
    return INTFOLD((int32_t)u);
  }
#else
  return INTFOLD((int32_t)(uint32_t)knumleft);
#endif
}